

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9SatClp(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint nCubeLim;
  uint uVar3;
  Vec_Str_t *__ptr;
  char *pcVar4;
  char *pcVar5;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_40 = 0;
  Extra_UtilGetoptReset();
  nCubeLim = 1000;
  local_44 = 1000000;
  local_3c = 0;
LAB_0028e4fa:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"CLcvh");
    iVar1 = globalUtilOptind;
    if (iVar2 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0028e5e3:
        Abc_Print(-1,pcVar4);
        goto LAB_0028e5ef;
      }
      nCubeLim = atoi(argv[globalUtilOptind]);
      uVar3 = nCubeLim;
    }
    else {
      if (0x62 < iVar2) {
        if (iVar2 == 99) {
          local_40 = local_40 ^ 1;
        }
        else {
          if (iVar2 != 0x76) goto LAB_0028e5ef;
          local_3c = local_3c ^ 1;
        }
        goto LAB_0028e4fa;
      }
      if (iVar2 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          __ptr = Bmc_CollapseOne(pAbc->pGia,nCubeLim,local_44,local_40,0,local_3c);
          if (__ptr->pArray != (char *)0x0) {
            free(__ptr->pArray);
          }
          free(__ptr);
          return 0;
        }
        Abc_Print(-1,"Abc_CommandAbc9SatClp(): There is no AIG.\n");
        return 0;
      }
      if (iVar2 != 0x4c) goto LAB_0028e5ef;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_0028e5e3;
      }
      local_44 = atoi(argv[globalUtilOptind]);
      uVar3 = local_44;
    }
    globalUtilOptind = iVar1 + 1;
    if ((int)uVar3 < 0) {
LAB_0028e5ef:
      Abc_Print(-2,"usage: &satclp [-CL num] [-cvh]\n");
      Abc_Print(-2,"\t         performs SAT based collapsing\n");
      Abc_Print(-2,"\t-C num : the limit on the SOP size of one output [default = %d]\n",
                (ulong)nCubeLim);
      Abc_Print(-2,
                "\t-L num : the limit on the number of conflicts in one SAT call [default = %d]\n",
                (ulong)local_44);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_40 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : toggles using canonical ISOP computation [default = %s]\n",pcVar4);
      if (local_3c == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9SatClp( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Str_t * Bmc_CollapseOne( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    int nCubeLim = 1000;
    int nBTLimit = 1000000;
    int fCanon   = 0;
    int fVerbose = 0;
    int c;

    Vec_Str_t * vSop;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CLcvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubeLim < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'c':
            fCanon ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9SatClp(): There is no AIG.\n" );
        return 0;
    }
    vSop = Bmc_CollapseOne( pAbc->pGia, nCubeLim, nBTLimit, fCanon, 0, fVerbose );
    Vec_StrFree( vSop );
    return 0;

usage:
    Abc_Print( -2, "usage: &satclp [-CL num] [-cvh]\n" );
    Abc_Print( -2, "\t         performs SAT based collapsing\n" );
    Abc_Print( -2, "\t-C num : the limit on the SOP size of one output [default = %d]\n", nCubeLim );
    Abc_Print( -2, "\t-L num : the limit on the number of conflicts in one SAT call [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-c     : toggles using canonical ISOP computation [default = %s]\n", fCanon? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}